

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int nng_dialer_close(nng_dialer did)

{
  int iVar1;
  nni_dialer *local_10;
  nni_dialer *d;
  
  iVar1 = nni_dialer_find(&local_10,did.id);
  if (iVar1 == 0) {
    nni_dialer_close(local_10);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nng_dialer_close(nng_dialer did)
{
	nni_dialer *d;
	int         rv;

	if ((rv = nni_dialer_find(&d, did.id)) != 0) {
		return (rv);
	}
	nni_dialer_close(d);
	return (0);
}